

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Image *image)

{
  string local_30;
  
  Image::toString_abi_cxx11_(&local_30,image);
  std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, Image& image)
{
    out << image.toString();

    return out;
}